

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.h
# Opt level: O0

bool mocker::detail::runOptPassImpl<mocker::DeadCodeElimination,mocker::FuncAttr&>
               (Module *module,FuncPass *param_2,FuncAttr *args)

{
  bool bVar1;
  FuncsMap *this;
  bool bVar2;
  DeadCodeElimination local_280;
  reference local_48;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::FunctionModule>
  *func;
  iterator __end2;
  iterator __begin2;
  FuncsMap *__range2;
  bool res;
  FuncAttr *args_local;
  FuncPass *param_1_local;
  Module *module_local;
  
  bVar2 = false;
  this = ir::Module::getFuncs_abi_cxx11_(module);
  __end2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::FunctionModule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::FunctionModule>_>_>
           ::begin(this);
  func = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::FunctionModule>
          *)std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::FunctionModule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::FunctionModule>_>_>
            ::end(this);
  while (bVar1 = std::__detail::operator!=
                           (&__end2.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::FunctionModule>,_true>
                            ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::FunctionModule>,_true>
                              *)&func), bVar1) {
    local_48 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::FunctionModule>,_false,_true>
               ::operator*(&__end2);
    bVar1 = ir::FunctionModule::isExternalFunc(&local_48->second);
    if (!bVar1) {
      DeadCodeElimination::DeadCodeElimination(&local_280,&local_48->second,args);
      bVar1 = DeadCodeElimination::operator()(&local_280);
      bVar2 = bVar2 != false || bVar1;
      DeadCodeElimination::~DeadCodeElimination(&local_280);
    }
    std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::FunctionModule>,_false,_true>
    ::operator++(&__end2);
  }
  return bVar2;
}

Assistant:

bool runOptPassImpl(ir::Module &module, FuncPass *, Args &&... args) {
  auto res = false;
  for (auto &func : module.getFuncs()) {
    if (func.second.isExternalFunc())
      continue;
    res |= Pass{func.second, std::forward<Args>(args)...}();
  }
  return res;
}